

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::execute
          (ComputeShaderExecutor *this,int numValues,void **inputs,void **outputs)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  int *piVar8;
  int local_40;
  int numToExec;
  int curOffset;
  deUint32 outputStride;
  deUint32 inputStride;
  int maxValuesPerInvocation;
  Functions *gl;
  void **outputs_local;
  void **inputs_local;
  int numValues_local;
  ComputeShaderExecutor *this_local;
  long lVar7;
  
  iVar2 = (*((this->super_BufferIoExecutor).super_ShaderExecutor.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  piVar8 = tcu::Vector<int,_3>::operator[](&this->m_maxWorkSize,0);
  iVar2 = *piVar8;
  dVar3 = BufferIoExecutor::getInputStride(&this->super_BufferIoExecutor);
  dVar4 = BufferIoExecutor::getOutputStride(&this->super_BufferIoExecutor);
  BufferIoExecutor::initBuffers(&this->super_BufferIoExecutor,numValues);
  BufferIoExecutor::uploadInputBuffer(&this->super_BufferIoExecutor,inputs,numValues);
  for (local_40 = 0; local_40 < numValues; local_40 = iVar5 + local_40) {
    iVar5 = de::min<int>(iVar2,numValues - local_40);
    if (dVar3 != 0) {
      pcVar1 = *(code **)(lVar7 + 0x50);
      dVar6 = BufferIoExecutor::getInputBuffer(&this->super_BufferIoExecutor);
      (*pcVar1)(0x90d2,0,dVar6,local_40 * dVar3,iVar5 * dVar3);
    }
    pcVar1 = *(code **)(lVar7 + 0x50);
    dVar6 = BufferIoExecutor::getOutputBuffer(&this->super_BufferIoExecutor);
    (*pcVar1)(0x90d2,1,dVar6,local_40 * dVar4,iVar5 * dVar4);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBufferRange(GL_SHADER_STORAGE_BUFFER)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x4cc);
    (**(code **)(lVar7 + 0x528))(iVar5,1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glDispatchCompute()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x4cf);
  }
  BufferIoExecutor::readOutputBuffer(&this->super_BufferIoExecutor,outputs,numValues);
  return;
}

Assistant:

void ComputeShaderExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&	gl						= m_renderCtx.getFunctions();
	const int				maxValuesPerInvocation	= m_maxWorkSize[0];
	const deUint32			inputStride				= getInputStride();
	const deUint32			outputStride			= getOutputStride();

	initBuffers(numValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	// Perform compute invocations
	{
		int curOffset = 0;
		while (curOffset < numValues)
		{
			const int numToExec = de::min(maxValuesPerInvocation, numValues-curOffset);

			if (inputStride > 0)
				gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, INPUT_BUFFER_BINDING, getInputBuffer(), curOffset*inputStride, numToExec*inputStride);

			gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, OUTPUT_BUFFER_BINDING, getOutputBuffer(), curOffset*outputStride, numToExec*outputStride);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_SHADER_STORAGE_BUFFER)");

			gl.dispatchCompute(numToExec, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

			curOffset += numToExec;
		}
	}

	// Read back data
	readOutputBuffer(outputs, numValues);
}